

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int glfwUpdateGamepadMappings(char *string)

{
  undefined1 *puVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  ushort **ppuVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  _GLFWmapping *p_Var10;
  char cVar11;
  char *pcVar12;
  long lVar13;
  byte bVar14;
  char *__s1;
  _GLFWmapping mapping;
  char line [1024];
  char *local_678;
  ushort **local_670;
  byte local_663 [128];
  undefined8 local_5e3;
  undefined8 uStack_5db;
  undefined8 local_5d3;
  undefined8 uStack_5cb;
  undefined1 local_5c2 [2];
  undefined1 local_5c0 [2];
  undefined1 local_5be [2];
  undefined1 local_5bc [2];
  undefined1 local_5ba [2];
  undefined1 local_5b8 [2];
  undefined1 local_5b6 [2];
  undefined1 local_5b4 [2];
  undefined1 local_5b2 [2];
  undefined1 local_5b0 [2];
  undefined1 local_5ae [2];
  undefined1 local_5ac [2];
  undefined1 local_5aa [2];
  undefined1 local_5a8 [2];
  undefined1 local_5a6 [2];
  undefined1 local_5a4 [2];
  undefined1 local_5a2 [2];
  undefined8 local_5a0;
  char *local_598;
  long local_590;
  char *local_588;
  undefined1 *local_580;
  char *local_578;
  undefined1 *local_570;
  char *local_568;
  undefined1 *local_560;
  char *local_558;
  undefined1 *local_550;
  char *local_548;
  undefined1 *local_540;
  char *local_538;
  undefined1 *local_530;
  char *local_528;
  undefined1 *local_520;
  char *local_518;
  undefined1 *local_510;
  char *local_508;
  undefined1 *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  long local_490;
  char *local_488;
  long local_480;
  char *local_478;
  undefined1 *local_470;
  char *local_468;
  undefined1 *local_460;
  char *local_458;
  undefined8 *local_450;
  char *local_448;
  long local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  char local_418;
  char local_417 [999];
  
  if (string == (char *)0x0) {
    __assert_fail("string != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/input.c"
                  ,0x41e,"int glfwUpdateGamepadMappings(const char *)");
  }
  if (_glfw.initialized == 0) {
    iVar4 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    cVar11 = *string;
    if (cVar11 != '\0') {
      ppuVar5 = __ctype_b_loc();
      local_670 = ppuVar5;
      do {
        if ((*(byte *)((long)*ppuVar5 + (long)cVar11 * 2 + 1) & 0x10) == 0) {
          sVar6 = strcspn(string,"\r\n");
          sVar7 = strspn(string + sVar6,"\r\n");
          string = string + sVar6 + sVar7;
        }
        else {
          sVar6 = strcspn(string,"\r\n");
          if (sVar6 < 0x400) {
            memset(local_663,0,0xcb);
            memcpy(&local_438,string,sVar6);
            *(undefined1 *)((long)&local_438 + sVar6) = 0;
            local_598 = "platform";
            local_590 = 0;
            local_588 = "a";
            local_580 = local_5c2;
            local_578 = "b";
            local_570 = local_5c0;
            local_568 = "x";
            local_560 = local_5be;
            local_558 = "y";
            local_550 = local_5bc;
            local_548 = "back";
            local_540 = local_5b6;
            local_538 = "start";
            local_530 = local_5b4;
            local_528 = "guide";
            local_520 = local_5b2;
            local_518 = "leftshoulder";
            local_510 = local_5ba;
            local_508 = "rightshoulder";
            local_500 = local_5b8;
            local_4f8 = "leftstick";
            local_4f0 = local_5b0;
            local_4e8 = "rightstick";
            local_4e0 = local_5ae;
            local_4d8 = "dpup";
            local_4d0 = local_5ac;
            local_4c8 = "dpright";
            local_4c0 = local_5aa;
            local_4b8 = "dpdown";
            local_4b0 = local_5a8;
            local_4a8 = "dpleft";
            local_4a0 = local_5a6;
            local_498 = "lefttrigger";
            local_490 = (long)&local_5a0 + 4;
            local_488 = "righttrigger";
            local_480 = (long)&local_5a0 + 6;
            local_478 = "leftx";
            local_470 = local_5a4;
            local_468 = "lefty";
            local_460 = local_5a2;
            local_458 = "rightx";
            local_450 = &local_5a0;
            local_448 = "righty";
            local_440 = (long)&local_5a0 + 2;
            local_678 = (char *)&local_438;
            sVar7 = strcspn((char *)&local_438,",");
            if ((sVar7 == 0x20) && (local_418 == ',')) {
              local_5d3 = local_428;
              uStack_5cb = uStack_420;
              local_5e3 = local_438;
              uStack_5db = uStack_430;
              local_678 = local_417;
              sVar7 = strcspn(local_678,",");
              if ((sVar7 < 0x80) && (local_417[sVar7] == ',')) {
                memcpy(local_663,local_417,sVar7);
                __s1 = local_417 + sVar7 + 1;
                cVar11 = local_417[sVar7 + 1];
                ppuVar5 = local_670;
                while (local_678 = __s1, local_670 = ppuVar5, cVar11 != '\0') {
                  lVar13 = 8;
                  do {
                    pcVar12 = *(char **)((long)&local_5a0 + lVar13);
                    sVar7 = strlen(pcVar12);
                    iVar4 = strncmp(__s1,pcVar12,sVar7);
                    if ((iVar4 == 0) && (__s1[sVar7] == ':')) {
                      local_678 = __s1 + sVar7 + 1;
                      puVar1 = *(undefined1 **)((long)&local_598 + lVar13);
                      if (puVar1 == (undefined1 *)0x0) {
                        iVar4 = strncmp(local_678,"Linux",5);
                        ppuVar5 = local_670;
                        if (iVar4 != 0) goto LAB_00133bc4;
                        break;
                      }
                      cVar11 = *local_678;
                      if (cVar11 == 'a') {
                        bVar2 = false;
                        uVar3 = 1;
                      }
                      else if (cVar11 == 'h') {
                        uVar3 = 3;
                        bVar2 = true;
                      }
                      else {
                        if (cVar11 != 'b') break;
                        uVar3 = 2;
                        bVar2 = false;
                      }
                      *puVar1 = uVar3;
                      uVar8 = strtoul(__s1 + sVar7 + 2,&local_678,10);
                      bVar14 = (byte)uVar8;
                      if (bVar2) {
                        uVar9 = strtoul(local_678 + 1,&local_678,10);
                        bVar14 = (byte)(uVar8 << 4) | (byte)uVar9;
                      }
                      puVar1[1] = bVar14;
                      break;
                    }
                    lVar13 = lVar13 + 0x10;
                  } while (lVar13 != 0x168);
                  pcVar12 = local_678;
                  sVar7 = strcspn(local_678,",");
                  pcVar12 = pcVar12 + sVar7;
                  local_678 = pcVar12;
                  sVar7 = strspn(pcVar12,",");
                  __s1 = pcVar12 + sVar7;
                  ppuVar5 = local_670;
                  cVar11 = pcVar12[sVar7];
                }
                lVar13 = 0x80;
                do {
                  if ((byte)(local_663[lVar13] + 0xbf) < 6) {
                    local_663[lVar13] = local_663[lVar13] | 0x20;
                  }
                  lVar13 = lVar13 + 1;
                } while (lVar13 != 0xa0);
                _glfwPlatformUpdateGamepadGUID((char *)&local_5e3);
                p_Var10 = findMapping((char *)&local_5e3);
                if (p_Var10 == (_GLFWmapping *)0x0) {
                  lVar13 = (long)_glfw.mappingCount;
                  _glfw.mappingCount = (int)(lVar13 + 1);
                  _glfw.mappings = (_GLFWmapping *)realloc(_glfw.mappings,(lVar13 + 1) * 0xcb);
                  p_Var10 = _glfw.mappings + (long)_glfw.mappingCount + -1;
                }
                memcpy(p_Var10,local_663,0xcb);
                goto LAB_00133bc4;
              }
            }
            _glfwInputError(0x10004,(char *)0x0);
            ppuVar5 = local_670;
          }
LAB_00133bc4:
          string = string + sVar6;
        }
        cVar11 = *string;
      } while (cVar11 != '\0');
    }
    lVar13 = 0;
    do {
      if (*(int *)(_glfw.joysticks[0].guid + lVar13 + -0x48) != 0) {
        p_Var10 = findValidMapping((_GLFWjoystick *)(_glfw.joysticks[0].guid + lVar13 + -0x48));
        *(_GLFWmapping **)(_glfw.joysticks[0].linjs.path + lVar13 + -0xc) = p_Var10;
      }
      lVar13 = lVar13 + 0x1fa0;
    } while (lVar13 != 0x1fa00);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

GLFWAPI int glfwUpdateGamepadMappings(const char* string)
{
    int jid;
    const char* c = string;

    assert(string != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    while (*c)
    {
        if (isxdigit(*c))
        {
            char line[1024];

            const size_t length = strcspn(c, "\r\n");
            if (length < sizeof(line))
            {
                _GLFWmapping mapping = {{0}};

                memcpy(line, c, length);
                line[length] = '\0';

                if (parseMapping(&mapping, line))
                {
                    _GLFWmapping* previous = findMapping(mapping.guid);
                    if (previous)
                        *previous = mapping;
                    else
                    {
                        _glfw.mappingCount++;
                        _glfw.mappings =
                            realloc(_glfw.mappings,
                                    sizeof(_GLFWmapping) * _glfw.mappingCount);
                        _glfw.mappings[_glfw.mappingCount - 1] = mapping;
                    }
                }
            }

            c += length;
        }
        else
        {
            c += strcspn(c, "\r\n");
            c += strspn(c, "\r\n");
        }
    }

    for (jid = 0;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        _GLFWjoystick* js = _glfw.joysticks + jid;
        if (js->present)
            js->mapping = findValidMapping(js);
    }

    return GLFW_TRUE;
}